

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O2

void testing::internal::JsonUnitTestResultPrinter::OutputJsonTestSuiteForTestResult
               (ostream *stream,TestResult *result)

{
  TestResult *pTVar1;
  ostream *poVar2;
  ostream *poVar3;
  size_t in_RDX;
  size_t width;
  size_t width_00;
  size_t extraout_RDX;
  size_t width_01;
  size_t width_02;
  size_t width_03;
  size_t width_04;
  TimeInMillis ms;
  size_t width_05;
  TimeInMillis ms_00;
  size_t width_06;
  size_t extraout_RDX_00;
  size_t width_07;
  size_t width_08;
  size_t width_09;
  size_t width_10;
  size_t width_11;
  TimeInMillis ms_01;
  size_t width_12;
  TimeInMillis ms_02;
  size_t width_13;
  size_t width_14;
  size_t width_15;
  size_t width_16;
  size_t width_17;
  allocator<char> local_c3;
  allocator<char> local_c2;
  allocator<char> local_c1;
  string local_c0;
  TestResult *local_a0;
  string local_98;
  string local_78;
  string local_58;
  ostream *local_38;
  
  local_a0 = result;
  Indent_abi_cxx11_(&local_c0,(internal *)0x4,in_RDX);
  poVar2 = std::operator<<(stream,(string *)&local_c0);
  std::operator<<(poVar2,"{\n");
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_c0,"testsuite",&local_c3);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_98,"name",&local_c2);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_58,"NonTestSuiteFailure",&local_c1);
  Indent_abi_cxx11_(&local_78,(internal *)0x6,width);
  OutputJsonKey(stream,&local_c0,&local_98,&local_58,&local_78,true);
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_c0,"testsuite",(allocator<char> *)&local_78);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_98,"tests",&local_c3);
  Indent_abi_cxx11_(&local_58,(internal *)0x6,width_00);
  local_38 = stream;
  OutputJsonKey(stream,&local_c0,&local_98,1,&local_58,true);
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  width_07 = extraout_RDX;
  if (FLAGS_gtest_list_tests == '\0') {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_c0,"testsuite",(allocator<char> *)&local_78);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_98,"failures",&local_c3);
    Indent_abi_cxx11_(&local_58,(internal *)0x6,width_01);
    poVar2 = local_38;
    OutputJsonKey(local_38,&local_c0,&local_98,1,&local_58,true);
    std::__cxx11::string::_M_dispose();
    std::__cxx11::string::_M_dispose();
    std::__cxx11::string::_M_dispose();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_c0,"testsuite",(allocator<char> *)&local_78);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_98,"disabled",&local_c3);
    Indent_abi_cxx11_(&local_58,(internal *)0x6,width_02);
    OutputJsonKey(poVar2,&local_c0,&local_98,0,&local_58,true);
    std::__cxx11::string::_M_dispose();
    std::__cxx11::string::_M_dispose();
    std::__cxx11::string::_M_dispose();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_c0,"testsuite",(allocator<char> *)&local_78);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_98,"skipped",&local_c3);
    Indent_abi_cxx11_(&local_58,(internal *)0x6,width_03);
    OutputJsonKey(poVar2,&local_c0,&local_98,0,&local_58,true);
    std::__cxx11::string::_M_dispose();
    std::__cxx11::string::_M_dispose();
    std::__cxx11::string::_M_dispose();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_c0,"testsuite",(allocator<char> *)&local_78);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_98,"errors",&local_c3);
    Indent_abi_cxx11_(&local_58,(internal *)0x6,width_04);
    OutputJsonKey(poVar2,&local_c0,&local_98,0,&local_58,true);
    std::__cxx11::string::_M_dispose();
    std::__cxx11::string::_M_dispose();
    std::__cxx11::string::_M_dispose();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_c0,"testsuite",&local_c3);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_98,"time",&local_c2);
    pTVar1 = local_a0;
    FormatTimeInMillisAsDuration_abi_cxx11_(&local_58,(internal *)local_a0->elapsed_time_,ms);
    Indent_abi_cxx11_(&local_78,(internal *)0x6,width_05);
    OutputJsonKey(poVar2,&local_c0,&local_98,&local_58,&local_78,true);
    std::__cxx11::string::_M_dispose();
    std::__cxx11::string::_M_dispose();
    std::__cxx11::string::_M_dispose();
    std::__cxx11::string::_M_dispose();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_c0,"testsuite",&local_c3);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_98,"timestamp",&local_c2);
    FormatEpochTimeInMillisAsRFC3339_abi_cxx11_
              (&local_58,(internal *)pTVar1->start_timestamp_,ms_00);
    Indent_abi_cxx11_(&local_78,(internal *)0x6,width_06);
    OutputJsonKey(poVar2,&local_c0,&local_98,&local_58,&local_78,true);
    std::__cxx11::string::_M_dispose();
    std::__cxx11::string::_M_dispose();
    std::__cxx11::string::_M_dispose();
    std::__cxx11::string::_M_dispose();
    width_07 = extraout_RDX_00;
  }
  Indent_abi_cxx11_(&local_c0,(internal *)0x6,width_07);
  poVar2 = local_38;
  poVar3 = std::operator<<(local_38,(string *)&local_c0);
  std::operator<<(poVar3,"\"testsuite\": [\n");
  std::__cxx11::string::_M_dispose();
  Indent_abi_cxx11_(&local_c0,(internal *)0x8,width_08);
  poVar3 = std::operator<<(poVar2,(string *)&local_c0);
  std::operator<<(poVar3,"{\n");
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_c0,"testcase",&local_c3);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_98,"name",&local_c2);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"",&local_c1);
  Indent_abi_cxx11_(&local_78,(internal *)0xa,width_09);
  OutputJsonKey(poVar2,&local_c0,&local_98,&local_58,&local_78,true);
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_c0,"testcase",&local_c3);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_98,"status",&local_c2);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"RUN",&local_c1);
  Indent_abi_cxx11_(&local_78,(internal *)0xa,width_10);
  OutputJsonKey(poVar2,&local_c0,&local_98,&local_58,&local_78,true);
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_c0,"testcase",&local_c3);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_98,"result",&local_c2);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"COMPLETED",&local_c1);
  Indent_abi_cxx11_(&local_78,(internal *)0xa,width_11);
  OutputJsonKey(poVar2,&local_c0,&local_98,&local_58,&local_78,true);
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_c0,"testcase",&local_c3);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_98,"timestamp",&local_c2);
  pTVar1 = local_a0;
  FormatEpochTimeInMillisAsRFC3339_abi_cxx11_
            (&local_58,(internal *)local_a0->start_timestamp_,ms_01);
  Indent_abi_cxx11_(&local_78,(internal *)0xa,width_12);
  OutputJsonKey(poVar2,&local_c0,&local_98,&local_58,&local_78,true);
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_c0,"testcase",&local_c3);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_98,"time",&local_c2);
  FormatTimeInMillisAsDuration_abi_cxx11_(&local_58,(internal *)pTVar1->elapsed_time_,ms_02);
  Indent_abi_cxx11_(&local_78,(internal *)0xa,width_13);
  OutputJsonKey(poVar2,&local_c0,&local_98,&local_58,&local_78,true);
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_c0,"testcase",&local_c3);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_98,"classname",&local_c2);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"",&local_c1);
  Indent_abi_cxx11_(&local_78,(internal *)0xa,width_14);
  OutputJsonKey(poVar2,&local_c0,&local_98,&local_58,&local_78,false);
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  Indent_abi_cxx11_(&local_98,(internal *)0xa,width_15);
  pTVar1 = local_a0;
  TestPropertiesAsJson(&local_c0,local_a0,&local_98);
  std::operator<<(poVar2,(string *)&local_c0);
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  OutputJsonTestResult(poVar2,pTVar1);
  poVar2 = std::operator<<(poVar2,"\n");
  Indent_abi_cxx11_(&local_c0,(internal *)0x6,width_16);
  poVar2 = std::operator<<(poVar2,(string *)&local_c0);
  poVar2 = std::operator<<(poVar2,"]\n");
  Indent_abi_cxx11_(&local_98,(internal *)0x4,width_17);
  poVar2 = std::operator<<(poVar2,(string *)&local_98);
  std::operator<<(poVar2,"}");
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  return;
}

Assistant:

void JsonUnitTestResultPrinter::OutputJsonTestSuiteForTestResult(
    ::std::ostream* stream, const TestResult& result) {
  // Output the boilerplate for a new test suite.
  *stream << Indent(4) << "{\n";
  OutputJsonKey(stream, "testsuite", "name", "NonTestSuiteFailure", Indent(6));
  OutputJsonKey(stream, "testsuite", "tests", 1, Indent(6));
  if (!GTEST_FLAG_GET(list_tests)) {
    OutputJsonKey(stream, "testsuite", "failures", 1, Indent(6));
    OutputJsonKey(stream, "testsuite", "disabled", 0, Indent(6));
    OutputJsonKey(stream, "testsuite", "skipped", 0, Indent(6));
    OutputJsonKey(stream, "testsuite", "errors", 0, Indent(6));
    OutputJsonKey(stream, "testsuite", "time",
                  FormatTimeInMillisAsDuration(result.elapsed_time()),
                  Indent(6));
    OutputJsonKey(stream, "testsuite", "timestamp",
                  FormatEpochTimeInMillisAsRFC3339(result.start_timestamp()),
                  Indent(6));
  }
  *stream << Indent(6) << "\"testsuite\": [\n";

  // Output the boilerplate for a new test case.
  *stream << Indent(8) << "{\n";
  OutputJsonKey(stream, "testcase", "name", "", Indent(10));
  OutputJsonKey(stream, "testcase", "status", "RUN", Indent(10));
  OutputJsonKey(stream, "testcase", "result", "COMPLETED", Indent(10));
  OutputJsonKey(stream, "testcase", "timestamp",
                FormatEpochTimeInMillisAsRFC3339(result.start_timestamp()),
                Indent(10));
  OutputJsonKey(stream, "testcase", "time",
                FormatTimeInMillisAsDuration(result.elapsed_time()),
                Indent(10));
  OutputJsonKey(stream, "testcase", "classname", "", Indent(10), false);
  *stream << TestPropertiesAsJson(result, Indent(10));

  // Output the actual test result.
  OutputJsonTestResult(stream, result);

  // Finish the test suite.
  *stream << "\n" << Indent(6) << "]\n" << Indent(4) << "}";
}